

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O2

void setup_rel32(gen_ctx_t gen_ctx,label_ref_t *lr,uint8_t *base,void *addr)

{
  int32_t rel32;
  
  if ((lr->abs_addr_p == '\0') &&
     (((long)addr - (long)(base + lr->next_insn_disp)) + 0x80000000U >> 0x20 == 0)) {
    _MIR_change_code(gen_ctx->ctx,base + lr->label_val_disp,(uint8_t *)&rel32,4);
    return;
  }
  fprintf(_stderr,"too big offset (%lld) in setup_rel32",
          (long)addr - (long)(base + lr->next_insn_disp));
  exit(1);
}

Assistant:

static void setup_rel32 (gen_ctx_t gen_ctx, label_ref_t *lr, uint8_t *base, void *addr) {
  MIR_context_t ctx = gen_ctx->ctx;
  int64_t offset = (int64_t) addr - (int64_t) (base + lr->next_insn_disp);
  int32_t rel32 = (int32_t) offset;

  if (lr->abs_addr_p || !(INT32_MIN <= offset && offset <= INT32_MAX)) {
    fprintf (stderr, "too big offset (%lld) in setup_rel32", (long long) offset);
    exit (1);
  }
  _MIR_change_code (ctx, (uint8_t *) base + lr->label_val_disp, (uint8_t *) &rel32, 4);
}